

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O1

void test_common<short>(uint length,short value)

{
  ulong uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  uint i;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  undefined8 *puVar7;
  shared_ptr<short> pa;
  shared_ptr<short> pb;
  
  uVar1 = (ulong)length;
  uVar5 = 0xffffffffffffffff;
  if (-1 < (int)(length + 1)) {
    uVar5 = (long)(int)(length + 1) * 2;
  }
  pvVar4 = operator_new__(uVar5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<short*,void(*)(short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,pvVar4,nosimd::common::free<short>);
  pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<short*,void(*)(short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,
             pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<short>);
  _Var2._M_pi = pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(undefined2 *)((long)pvVar4 + uVar1 * 2) = 0x7f;
  *(undefined2 *)
   ((long)&(pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar1 * 2) = 0x3f;
  if (0 < (int)length) {
    uVar5 = 0;
    do {
      *(short *)((long)pvVar4 + uVar5 * 2) = value;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  if (length != 0) {
    lVar6 = 0;
    do {
      if (*(short *)((long)pvVar4 + lVar6 * 2) != value) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar7 = "void test_common(unsigned int, T) [T = short]";
        *(undefined4 *)(puVar7 + 1) = 0x16;
        *(uint *)((long)puVar7 + 0xc) = length;
        __cxa_throw(puVar7,&Exception::typeinfo,0);
      }
      lVar6 = lVar6 + 1;
    } while (length != (uint)lVar6);
  }
  if (0 < (int)length) {
    uVar5 = 0;
    do {
      *(undefined2 *)
       ((long)&(pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _vptr__Sp_counted_base + uVar5 * 2) = *(undefined2 *)((long)pvVar4 + uVar5 * 2);
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  if (length != 0) {
    lVar6 = 0;
    do {
      if (*(short *)((long)&(pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + lVar6 * 2) != value) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar7 = "void test_common(unsigned int, T) [T = short]";
        *(undefined4 *)(puVar7 + 1) = 0x1d;
        *(uint *)((long)puVar7 + 0xc) = length;
        __cxa_throw(puVar7,&Exception::typeinfo,0);
      }
      lVar6 = lVar6 + 1;
    } while (length != (uint)lVar6);
  }
  if (0 < (int)length) {
    memset(pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,0,
           (ulong)(length * 2));
  }
  if (length != 0) {
    lVar6 = 0;
    do {
      if (*(short *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + lVar6 * 2) != 0) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar7 = "void test_common(unsigned int, T) [T = short]";
        *(undefined4 *)(puVar7 + 1) = 0x24;
        *(uint *)((long)puVar7 + 0xc) = length;
        __cxa_throw(puVar7,&Exception::typeinfo,0);
      }
      lVar6 = lVar6 + 1;
    } while (length != (uint)lVar6);
    uVar5 = 0;
    do {
      *(short *)((long)pvVar4 + uVar5 * 2) = (short)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  if (0 < (int)length) {
    uVar5 = 0;
    do {
      *(undefined2 *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + uVar5 * 2) =
           *(undefined2 *)((long)pvVar4 + uVar5 * 2);
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  if (length != 0) {
    iVar3 = 0;
    lVar6 = 0;
    do {
      if (iVar3 >> 0x10 != (int)*(short *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + lVar6 * 2)
         ) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar7 = "void test_common(unsigned int, T) [T = short]";
        *(undefined4 *)(puVar7 + 1) = 0x2d;
        *(uint *)((long)puVar7 + 0xc) = length;
        __cxa_throw(puVar7,&Exception::typeinfo,0);
      }
      lVar6 = lVar6 + 1;
      iVar3 = iVar3 + 0x10000;
    } while (length != (uint)lVar6);
  }
  if ((*(short *)((long)pvVar4 + uVar1 * 2) == 0x7f) &&
     (*(short *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + uVar1 * 2) == 0x3f)) {
    if (pb.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar7 = "void test_common(unsigned int, T) [T = short]";
  *(undefined4 *)(puVar7 + 1) = 0x31;
  *(uint *)((long)puVar7 + 0xc) = length;
  __cxa_throw(puVar7,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}